

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

void __thiscall
boost::ext::ut::v1_1_8::runner<ApprovalTests::cfg::reporter,16>::
on<void(*)(),boost::ext::ut::v1_1_8::none>
          (runner<ApprovalTests::cfg::reporter,_16> *this,
          test<void_(*)(),_boost::ext::ut::v1_1_8::none> *test)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  test_run test_run;
  skip<boost::ext::ut::v1_1_8::none> test_00;
  skip<boost::ext::ut::v1_1_8::none> test_01;
  test_begin test_begin;
  bool bVar1;
  reference pvVar2;
  reference pbVar3;
  size_t sVar4;
  test_end *in_RSI;
  char *pcVar5;
  reporter *in_RDI;
  fatal_assertion *anon_var_0;
  exception *exception;
  uint i;
  basic_string_view<char,_std::char_traits<char>_> *ftag;
  iterator __end5;
  iterator __begin5;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range5;
  string_view *tag;
  iterator __end0;
  iterator __begin0;
  vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  *__range4;
  bool execute;
  vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  *in_stack_fffffffffffffdf8;
  char *__n;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL> *in_stack_fffffffffffffe00;
  basic_ostream<char,_std::char_traits<char>_> *__os;
  char *in_stack_fffffffffffffe08;
  char *pcVar6;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe10;
  char *pcVar7;
  runner<ApprovalTests::cfg::reporter,_16> *in_stack_fffffffffffffe30;
  test_end *this_00;
  undefined8 in_stack_fffffffffffffe50;
  unsigned_long in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  string_view in_stack_fffffffffffffe70;
  string_view in_stack_fffffffffffffe80;
  uint local_14c;
  reporter *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffff40;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_a0;
  undefined1 *local_98;
  char *local_90;
  unsigned_long uStack_88;
  char *local_80;
  unsigned_long uStack_78;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  reference local_48;
  string_view *local_40;
  __normal_iterator<boost::ext::ut::v1_1_8::utility::string_view_*,_std::vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>_>
  local_38;
  test_end *local_30;
  byte local_21;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  this_00 = in_RSI;
  local_20 = utility::string_view::operator_cast_to_basic_string_view((string_view *)0x1144af);
  pvVar2 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL>::operator[]
                     (in_stack_fffffffffffffe00,(size_type)in_stack_fffffffffffffdf8);
  pvVar2->_M_len = local_20._M_len;
  pvVar2->_M_str = local_20._M_str;
  local_21 = std::
             empty<std::vector<boost::ext::ut::v1_1_8::utility::string_view,std::allocator<boost::ext::ut::v1_1_8::utility::string_view>>>
                       ((vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                         *)0x114502);
  local_30 = this_00 + 1;
  local_38._M_current =
       (string_view *)
       std::
       vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
       ::begin(in_stack_fffffffffffffdf8);
  local_40 = (string_view *)
             std::
             vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
             ::end(in_stack_fffffffffffffdf8);
  do {
    bVar1 = __gnu_cxx::
            operator==<boost::ext::ut::v1_1_8::utility::string_view_*,_std::vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>_>
                      ((__normal_iterator<boost::ext::ut::v1_1_8::utility::string_view_*,_std::vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>_>
                        *)in_stack_fffffffffffffe00,
                       (__normal_iterator<boost::ext::ut::v1_1_8::utility::string_view_*,_std::vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>_>
                        *)in_stack_fffffffffffffdf8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if ((local_21 & 1) == 0) {
        test_01.type.size_ = (unsigned_long)this_00;
        test_01.type.data_ = (char *)in_RDI;
        test_01.name.data_ = (char *)in_stack_fffffffffffffe50;
        test_01.name.size_ = in_stack_fffffffffffffe58;
        test_01._32_8_ = in_stack_fffffffffffffe60;
        runner<ApprovalTests::cfg::reporter,_16>::on<boost::ext::ut::v1_1_8::none>
                  (in_stack_fffffffffffffe30,test_01);
      }
      else {
        bVar1 = filter::operator()((filter *)this_00,(size_t)in_RDI,
                                   (array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL>
                                    *)in_RSI);
        if (bVar1) {
          sVar4 = in_RDI[1].super_reporter<boost::ext::ut::v1_1_8::printer>.asserts_.pass;
          in_RDI[1].super_reporter<boost::ext::ut::v1_1_8::printer>.asserts_.pass = sVar4 + 1;
          if (sVar4 == 0) {
            __n = (this_00->type).data_;
            __os = (basic_ostream<char,_std::char_traits<char>_> *)(this_00->type).size_;
            pcVar6 = (this_00->name).data_;
            pcVar7 = (char *)(this_00->name).size_;
            test_begin.type.size_ = in_stack_ffffffffffffff28;
            test_begin.type.data_ = (char *)in_stack_ffffffffffffff20;
            test_begin.name.data_ = (char *)in_stack_ffffffffffffff30;
            test_begin.name.size_ = (unsigned_long)in_stack_ffffffffffffff38;
            test_begin.location = (source_location)in_stack_ffffffffffffff40;
            ApprovalTests::cfg::reporter::on(in_stack_ffffffffffffff10,test_begin);
          }
          else {
            __n = (this_00->type).data_;
            __os = (basic_ostream<char,_std::char_traits<char>_> *)(this_00->type).size_;
            pcVar6 = (this_00->name).data_;
            pcVar7 = (char *)(this_00->name).size_;
            test_run.type.size_ = (unsigned_long)this_00;
            test_run.type.data_ = (char *)in_RDI;
            test_run.name.data_ = (char *)in_stack_fffffffffffffe50;
            test_run.name.size_ = in_stack_fffffffffffffe58;
            ApprovalTests::cfg::reporter::on(&in_stack_fffffffffffffe30->reporter_,test_run);
          }
          if ((in_RDI[1].super_reporter<boost::ext::ut::v1_1_8::printer>.printer_.field_0x130 & 1)
              != 0) {
            for (local_14c = 0;
                (ulong)local_14c <
                in_RDI[1].super_reporter<boost::ext::ut::v1_1_8::printer>.asserts_.pass;
                local_14c = local_14c + 1) {
              pcVar5 = "";
              if (local_14c != 0) {
                pcVar5 = ".";
              }
              std::operator<<((ostream *)&std::cout,pcVar5);
              std::array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL>::operator[]
                        ((array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL> *)__os,
                         (size_type)__n);
              __str._M_str = pcVar7;
              __str._M_len = (size_t)pcVar6;
              std::operator<<(__os,__str);
            }
            std::operator<<((ostream *)&std::cout,'\n');
          }
          events::test<void_(*)(),_boost::ext::ut::v1_1_8::none>::operator()
                    ((test<void_(*)(),_boost::ext::ut::v1_1_8::none> *)0x1149cc);
          sVar4 = in_RDI[1].super_reporter<boost::ext::ut::v1_1_8::printer>.asserts_.pass - 1;
          in_RDI[1].super_reporter<boost::ext::ut::v1_1_8::printer>.asserts_.pass = sVar4;
          if (sVar4 == 0) {
            ApprovalTests::cfg::reporter::on(in_RDI,*this_00);
          }
        }
      }
      return;
    }
    local_48 = __gnu_cxx::
               __normal_iterator<boost::ext::ut::v1_1_8::utility::string_view_*,_std::vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>_>
               ::operator*(&local_38);
    local_58 = utility::string_view::operator_cast_to_basic_string_view((string_view *)0x114588);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    bVar1 = utility::is_match(in_stack_fffffffffffffe80,in_stack_fffffffffffffe70);
    if (bVar1) {
      local_90 = (this_00->type).data_;
      uStack_88 = (this_00->type).size_;
      local_80 = (this_00->name).data_;
      uStack_78 = (this_00->name).size_;
      test_00.type.size_ = (unsigned_long)this_00;
      test_00.type.data_ = (char *)in_RDI;
      test_00.name.data_ = (char *)in_stack_fffffffffffffe50;
      test_00.name.size_ = in_stack_fffffffffffffe58;
      test_00._32_8_ = in_stack_fffffffffffffe60;
      runner<ApprovalTests::cfg::reporter,_16>::on<boost::ext::ut::v1_1_8::none>
                (in_stack_fffffffffffffe30,test_00);
      return;
    }
    local_98 = &in_RDI[1].super_reporter<boost::ext::ut::v1_1_8::printer>.printer_.field_0x118;
    local_a0._M_current =
         (basic_string_view<char,_std::char_traits<char>_> *)
         std::
         vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)in_stack_fffffffffffffdf8);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *)in_stack_fffffffffffffdf8);
    while (bVar1 = __gnu_cxx::
                   operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             ((__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                               *)in_stack_fffffffffffffe00,
                              (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                               *)in_stack_fffffffffffffdf8), ((bVar1 ^ 0xffU) & 1) != 0) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               ::operator*(&local_a0);
      in_stack_ffffffffffffff40 =
           utility::string_view::operator_cast_to_basic_string_view((string_view *)0x1146bf);
      in_stack_ffffffffffffff30 = pbVar3->_M_len;
      in_stack_ffffffffffffff38 = pbVar3->_M_str;
      bVar1 = utility::is_match(in_stack_fffffffffffffe80,in_stack_fffffffffffffe70);
      if (bVar1) {
        local_21 = 1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::operator++(&local_a0);
    }
    __gnu_cxx::
    __normal_iterator<boost::ext::ut::v1_1_8::utility::string_view_*,_std::vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>_>
    ::operator++(&local_38);
  } while( true );
}

Assistant:

auto on(events::test<Ts...> test) {
      path_[level_] = test.name;

      auto execute = std::empty(test.tag);
      for (const auto& tag : test.tag) {
        if (utility::is_match(tag, "skip")) {
          on(events::skip<>{.type = test.type, .name = test.name});
          return;
        }

        for (const auto& ftag : tag_) {
          if (utility::is_match(tag, ftag)) {
            execute = true;
            break;
          }
        }
      }

      if (not execute) {
        on(events::skip<>{.type = test.type, .name = test.name});
        return;
      }

      if (filter_(level_, path_)) {
        if (not level_++) {
          reporter_.on(events::test_begin{
              .type = test.type, .name = test.name, .location = test.location});
        } else {
          reporter_.on(events::test_run{.type = test.type, .name = test.name});
        }

        if (dry_run_) {
          for (auto i = 0u; i < level_; ++i) {
            std::cout << (i ? "." : "") << path_[i];
          }
          std::cout << '\n';
        }

#if defined(__cpp_exceptions)
        try {
#endif
          test();
#if defined(__cpp_exceptions)
        } catch (const events::fatal_assertion&) {
        } catch (const std::exception& exception) {
          ++fails_;
          reporter_.on(events::exception{exception.what()});
        } catch (...) {
          ++fails_;
          reporter_.on(events::exception{"Unknown exception"});
        }
#endif

        if (not--level_) {
          reporter_.on(events::test_end{.type = test.type, .name = test.name});
        }
      }
    }